

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

_Bool Curl_conn_is_multiplex(connectdata *conn,int sockindex)

{
  uint uVar1;
  Curl_cfilter *pCVar2;
  
  if (conn == (connectdata *)0x0) {
    pCVar2 = (Curl_cfilter *)0x0;
  }
  else {
    pCVar2 = conn->cfilter[sockindex];
  }
  if (pCVar2 == (Curl_cfilter *)0x0) {
    return false;
  }
  do {
    uVar1 = pCVar2->cft->flags;
    if ((uVar1 & 7) != 0) break;
    pCVar2 = pCVar2->next;
  } while (pCVar2 != (Curl_cfilter *)0x0);
  return SUB41((uVar1 & 4) >> 2,0);
}

Assistant:

bool Curl_conn_is_multiplex(struct connectdata *conn, int sockindex)
{
  struct Curl_cfilter *cf = conn ? conn->cfilter[sockindex] : NULL;

  for(; cf; cf = cf->next) {
    if(cf->cft->flags & CF_TYPE_MULTIPLEX)
      return TRUE;
    if(cf->cft->flags & (CF_TYPE_IP_CONNECT|CF_TYPE_SSL))
      return FALSE;
  }
  return FALSE;
}